

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

size_t __thiscall geometrycentral::surface::SurfaceMesh::nConnectedComponents(SurfaceMesh *this)

{
  pointer puVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  size_t i;
  ulong x;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  distinctComponents;
  DisjointSets dj;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  VertexData<size_t> vertInd;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> local_100;
  undefined1 local_e8 [56];
  DisjointSets local_b0;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> local_78;
  VertexData<size_t> local_60;
  
  getVertexIndices(&local_60,this);
  DisjointSets::DisjointSets(&local_b0,this->nVerticesCount);
  local_e8._16_8_ = this->nEdgesFillCount;
  local_e8._8_8_ = 0;
  local_e8._0_8_ = this;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            (&local_100,(RangeSetBase<geometrycentral::surface::EdgeRangeF> *)local_e8);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            (&local_78,(RangeSetBase<geometrycentral::surface::EdgeRangeF> *)local_e8);
  while (local_100.iCurr != local_78.iCurr) {
    if ((local_100.mesh)->useImplicitTwinFlag == true) {
      uVar4 = local_100.iCurr * 2;
    }
    else {
      uVar4 = ((local_100.mesh)->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_100.iCurr];
    }
    if ((local_100.mesh)->useImplicitTwinFlag == false) {
      uVar3 = ((local_100.mesh)->heSiblingArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [((local_100.mesh)->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[local_100.iCurr]];
    }
    else {
      uVar3 = local_100.iCurr * 2 + 1;
    }
    puVar1 = ((local_100.mesh)->heVertexArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    DisjointSets::merge(&local_b0,
                        local_60.data.
                        super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[puVar1[uVar4]],
                        local_60.data.
                        super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[puVar1[uVar3]]);
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++(&local_100);
  }
  local_e8._0_8_ = local_e8 + 0x30;
  local_e8._8_8_ = 1;
  local_e8._16_8_ = (_Hash_node_base *)0x0;
  local_e8._24_8_ = 0;
  local_e8._32_4_ = 1.0;
  local_e8._40_8_ = 0;
  local_e8._48_8_ = (__node_base_ptr)0x0;
  for (x = 0; uVar2 = local_e8._24_8_, x < this->nVerticesCount; x = x + 1) {
    local_100.mesh = (ParentMeshT *)DisjointSets::find(&local_b0,x);
    ::std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)local_e8,(value_type *)&local_100);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  DisjointSets::~DisjointSets(&local_b0);
  MeshData<geometrycentral::surface::Vertex,_unsigned_long>::~MeshData(&local_60);
  return uVar2;
}

Assistant:

size_t SurfaceMesh::nConnectedComponents() {
  VertexData<size_t> vertInd = getVertexIndices();
  DisjointSets dj(nVertices());
  for (Edge e : edges()) {
    dj.merge(vertInd[e.halfedge().vertex()], vertInd[e.halfedge().twin().vertex()]);
  }
  std::unordered_set<size_t> distinctComponents;
  for (size_t i = 0; i < nVertices(); i++) {
    distinctComponents.insert(dj.find(i));
  }
  return distinctComponents.size();
}